

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeasingcurve.cpp
# Opt level: O0

void __thiscall QEasingCurve::QEasingCurve(QEasingCurve *this,QEasingCurve *other)

{
  QEasingCurvePrivate *other_00;
  undefined8 *in_RDI;
  QEasingCurvePrivate *in_stack_ffffffffffffffe0;
  
  other_00 = (QEasingCurvePrivate *)operator_new(0x18);
  QEasingCurvePrivate::QEasingCurvePrivate(in_stack_ffffffffffffffe0,other_00);
  *in_RDI = other_00;
  return;
}

Assistant:

QEasingCurve::QEasingCurve(const QEasingCurve &other)
    : d_ptr(new QEasingCurvePrivate(*other.d_ptr))
{
    // ### non-atomic, requires malloc on shallow copy
}